

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O0

int Curl_parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,char *netrcfile)

{
  char *pcVar1;
  __uid_t __uid;
  int iVar2;
  passwd *local_490;
  passwd *pw_res;
  passwd pw;
  char *homea;
  char *home;
  char pwbuf [1024];
  char *filealloc;
  int retcode;
  char *netrcfile_local;
  char **passwordp_local;
  char **loginp_local;
  char *host_local;
  store_netrc *store_local;
  
  pwbuf[0x3f8] = '\0';
  pwbuf[0x3f9] = '\0';
  pwbuf[0x3fa] = '\0';
  pwbuf[0x3fb] = '\0';
  pwbuf[0x3fc] = '\0';
  pwbuf[0x3fd] = '\0';
  pwbuf[0x3fe] = '\0';
  pwbuf[0x3ff] = '\0';
  if (netrcfile == (char *)0x0) {
    homea = (char *)0x0;
    pw.pw_shell = curl_getenv("HOME");
    pcVar1 = pw.pw_shell;
    if (pw.pw_shell == (char *)0x0) {
      __uid = geteuid();
      iVar2 = getpwuid_r(__uid,(passwd *)&pw_res,(char *)&home,0x400,&local_490);
      pcVar1 = homea;
      if ((iVar2 == 0) && (local_490 != (passwd *)0x0)) {
        homea = pw.pw_gecos;
        pcVar1 = homea;
      }
    }
    homea = pcVar1;
    if (homea == (char *)0x0) {
      return 1;
    }
    pwbuf._1016_8_ = curl_maprintf("%s%s.netrc",homea,"/");
    if ((char *)pwbuf._1016_8_ == (char *)0x0) {
      (*Curl_cfree)(pw.pw_shell);
      return -1;
    }
    filealloc._4_4_ = parsenetrc(store,host,loginp,passwordp,(char *)pwbuf._1016_8_);
    (*Curl_cfree)((void *)pwbuf._1016_8_);
    (*Curl_cfree)(pw.pw_shell);
  }
  else {
    filealloc._4_4_ = parsenetrc(store,host,loginp,passwordp,netrcfile);
  }
  return filealloc._4_4_;
}

Assistant:

int Curl_parsenetrc(struct store_netrc *store, const char *host,
                    char **loginp, char **passwordp,
                    char *netrcfile)
{
  int retcode = 1;
  char *filealloc = NULL;

  if(!netrcfile) {
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    char pwbuf[1024];
#endif
    char *home = NULL;
    char *homea = curl_getenv("HOME"); /* portable environment reader */
    if(homea) {
      home = homea;
#if defined(HAVE_GETPWUID_R) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd pw, *pw_res;
      if(!getpwuid_r(geteuid(), &pw, pwbuf, sizeof(pwbuf), &pw_res)
         && pw_res) {
        home = pw.pw_dir;
      }
#elif defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
    }
    else {
      struct passwd *pw;
      pw = getpwuid(geteuid());
      if(pw) {
        home = pw->pw_dir;
      }
#elif defined(_WIN32)
    }
    else {
      homea = curl_getenv("USERPROFILE");
      if(homea) {
        home = homea;
      }
#endif
    }

    if(!home)
      return retcode; /* no home directory found (or possibly out of
                         memory) */

    filealloc = aprintf("%s%s.netrc", home, DIR_CHAR);
    if(!filealloc) {
      free(homea);
      return -1;
    }
    retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
    free(filealloc);
#ifdef _WIN32
    if(retcode == NETRC_FILE_MISSING) {
      /* fallback to the old-style "_netrc" file */
      filealloc = aprintf("%s%s_netrc", home, DIR_CHAR);
      if(!filealloc) {
        free(homea);
        return -1;
      }
      retcode = parsenetrc(store, host, loginp, passwordp, filealloc);
      free(filealloc);
    }
#endif
    free(homea);
  }